

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O0

void Wlc_ComputeSum(char *pRes,char *pAdd,int nBits,int Radix)

{
  char local_29;
  int local_28;
  char Sum;
  int i;
  char Carry;
  int Radix_local;
  int nBits_local;
  char *pAdd_local;
  char *pRes_local;
  
  Sum = '\0';
  local_28 = 0;
  while( true ) {
    if (nBits <= local_28) {
      if (Sum != '\0') {
        __assert_fail("Carry == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                      ,0x3c,"void Wlc_ComputeSum(char *, char *, int, int)");
      }
      return;
    }
    local_29 = pRes[local_28] + pAdd[local_28] + Sum;
    Sum = Radix <= local_29;
    if ((bool)Sum) {
      local_29 = local_29 - (char)Radix;
    }
    if ((local_29 < '\0') || (Radix <= local_29)) break;
    pRes[local_28] = local_29;
    local_28 = local_28 + 1;
  }
  __assert_fail("Sum >= 0 && Sum < Radix",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                ,0x39,"void Wlc_ComputeSum(char *, char *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Converts a bit-string into a number in a given radix.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_ComputeSum( char * pRes, char * pAdd, int nBits, int Radix )
{
    char Carry = 0;  int i; 
    for ( i = 0; i < nBits; i++ )
    {
        char Sum = pRes[i] + pAdd[i] + Carry;
        if ( Sum >= Radix )
        {
            Sum -= Radix;
            Carry = 1;
        }
        else 
            Carry = 0;
        assert( Sum >= 0 && Sum < Radix );
        pRes[i] = Sum;
    }
    assert( Carry == 0 );
}